

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O1

REF_STATUS
ref_search_trim(REF_SEARCH ref_search,REF_INT parent,REF_DBL *position,REF_DBL *trim_radius)

{
  int iVar1;
  REF_DBL *in_RAX;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  while ((parent != -1 && (parent < ref_search->n))) {
    in_RAX = (REF_DBL *)ref_search->item;
    lVar3 = (long)parent;
    if (*(int *)((long)in_RAX + lVar3 * 4) == -1) break;
    iVar1 = ref_search->d;
    if ((long)iVar1 < 1) {
      dVar4 = 0.0;
    }
    else {
      dVar4 = 0.0;
      lVar2 = 0;
      do {
        dVar5 = position[lVar2] - ref_search->pos[parent * iVar1 + lVar2];
        dVar4 = dVar4 + dVar5 * dVar5;
        lVar2 = lVar2 + 1;
      } while (iVar1 != lVar2);
    }
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar5 = ref_search->radius[lVar3] + dVar4;
    if (dVar5 < *trim_radius) {
      *trim_radius = dVar5;
    }
    in_RAX = ref_search->children_ball;
    if (*trim_radius <= dVar4 - in_RAX[lVar3]) break;
    ref_search_trim(ref_search,ref_search->left[lVar3],position,trim_radius);
    in_RAX = (REF_DBL *)ref_search->right;
    parent = *(int *)((long)in_RAX + lVar3 * 4);
  }
  return (REF_STATUS)in_RAX;
}

Assistant:

REF_FCN static REF_STATUS ref_search_trim(REF_SEARCH ref_search, REF_INT parent,
                                          REF_DBL *position,
                                          REF_DBL *trim_radius) {
  REF_INT i;
  REF_DBL distance;

  if (REF_EMPTY == parent) return REF_SUCCESS;
  if (parent >= ref_search->n) return REF_SUCCESS;
  if (REF_EMPTY == ref_search->item[parent]) return REF_SUCCESS;

  distance = 0.0;
  for (i = 0; i < ref_search->d; i++)
    distance +=
        pow(position[i] - ref_search->pos[i + ref_search->d * parent], 2);
  distance = sqrt(distance);

  if (distance + ref_search->radius[parent] < *trim_radius) {
    *trim_radius = distance + ref_search->radius[parent];
  }

  /* if the trim_distance is larger than the distance between me and the target
   * minus the children_ball look for better */
  if (*trim_radius > distance - ref_search->children_ball[parent]) {
    RSS(ref_search_trim(ref_search, ref_search->left[parent], position,
                        trim_radius),
        "gthr");
    RSS(ref_search_trim(ref_search, ref_search->right[parent], position,
                        trim_radius),
        "gthr");
  }

  return REF_SUCCESS;
}